

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

char * uv__strdup(char *s)

{
  size_t sVar1;
  char *m;
  size_t len;
  char *s_local;
  
  sVar1 = strlen(s);
  s_local = (char *)uv__malloc(sVar1 + 1);
  if (s_local == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    memcpy(s_local,s,sVar1 + 1);
  }
  return s_local;
}

Assistant:

char* uv__strdup(const char* s) {
  size_t len = strlen(s) + 1;
  char* m = uv__malloc(len);
  if (m == NULL)
    return NULL;
  return memcpy(m, s, len);
}